

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::getHessian
          (CostAttributes *this,VectorDynSize *values,MatrixDynSize *partialDerivative,string *label
          )

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  ostringstream errorTag;
  ostringstream errorMsg;
  long *local_358;
  long local_348 [2];
  long *local_338;
  long local_328 [2];
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  uVar2 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar2);
  if (this->m_valid == false) {
    iDynTree::MatrixDynSize::zero();
  }
  else {
    lVar3 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar4 = iDynTree::MatrixDynSize::cols();
    if (lVar3 != lVar4) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__cxx11::ostringstream::ostringstream(local_318);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_318,"costSecondPartialDerivativeWRT",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_318,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"The ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," dimension is not the one expected from the specified selector.",0x3f);
      std::__cxx11::stringbuf::str();
      plVar1 = local_338;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("L2NormCost",(char *)plVar1,(char *)local_358);
      if (local_358 != local_348) {
        operator_delete(local_358,local_348[0] + 1);
      }
      if (local_338 != local_328) {
        operator_delete(local_338,local_328[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_318);
      std::ios_base::~ios_base(local_2a8);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      std::ios_base::~ios_base(local_130);
      return false;
    }
    iDynTree::MatrixDynSize::operator=(partialDerivative,&this->hessianMatrix);
  }
  return true;
}

Assistant:

bool getHessian(const VectorDynSize& values, MatrixDynSize& partialDerivative, const std::string &label) {

                partialDerivative.resize(values.size(), values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costSecondPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                partialDerivative = hessianMatrix;

                return true;

            }